

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_add(pfx_table *pfx_table,pfx_record *record)

{
  pthread_rwlock_t *__rwlock;
  node_data *data;
  int iVar1;
  trie_node *root;
  data_elem *pdVar2;
  long in_FS_OFFSET;
  trie_node *new_node;
  _Bool found;
  uint lvl;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &pfx_table->lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  lvl = 0;
  if ((&pfx_table->ipv4)[(record->prefix).ver != LRTR_IPV4] == (trie_node *)0x0) {
    new_node = (trie_node *)0x0;
    iVar1 = pfx_table_create_node(&new_node,record);
    if (iVar1 == -1) {
LAB_00107c62:
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
LAB_00107c85:
      iVar1 = -1;
      goto LAB_00107c88;
    }
    (&pfx_table->ipv4)[(record->prefix).ver != LRTR_IPV4] = new_node;
LAB_00107c2a:
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  }
  else {
    root = trie_lookup_exact((&pfx_table->ipv4)[(record->prefix).ver != LRTR_IPV4],&record->prefix,
                             record->min_len,&lvl,&found);
    if (found != true) {
      new_node = (trie_node *)0x0;
      iVar1 = pfx_table_create_node(&new_node,record);
      if (iVar1 == -1) goto LAB_00107c62;
      trie_insert(root,new_node,lvl);
      goto LAB_00107c2a;
    }
    data = (node_data *)root->data;
    pdVar2 = pfx_table_find_elem(data,record,(uint *)0x0);
    if (pdVar2 != (data_elem *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      iVar1 = -2;
      goto LAB_00107c88;
    }
    iVar1 = pfx_table_append_elem(data,record);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    if (iVar1 != 0) goto LAB_00107c85;
  }
  iVar1 = 0;
  if (pfx_table->update_fp != (pfx_update_fp)0x0) {
    (*pfx_table->update_fp)(pfx_table,*record,true);
    iVar1 = 0;
  }
LAB_00107c88:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

RTRLIB_EXPORT int pfx_table_add(struct pfx_table *pfx_table, const struct pfx_record *record)
{
	pthread_rwlock_wrlock(&(pfx_table->lock));

	struct trie_node *root = pfx_table_get_root(pfx_table, record->prefix.ver);
	unsigned int lvl = 0;

	if (root) {
		bool found;
		struct trie_node *node = trie_lookup_exact(root, &(record->prefix), record->min_len, &lvl, &found);

		if (found) { // node with prefix exists
			if (pfx_table_find_elem(node->data, record, NULL)) {
				pthread_rwlock_unlock(&pfx_table->lock);
				return PFX_DUPLICATE_RECORD;
			}
			// append record to note_data array
			int rtval = pfx_table_append_elem(node->data, record);

			pthread_rwlock_unlock(&pfx_table->lock);
			if (rtval == PFX_SUCCESS)
				pfx_table_notify_clients(pfx_table, record, true);
			return rtval;
		}

		// no node with same prefix and prefix_len found
		struct trie_node *new_node = NULL;

		if (pfx_table_create_node(&new_node, record) == PFX_ERROR) {
			pthread_rwlock_unlock(&pfx_table->lock);
			return PFX_ERROR;
		}
		trie_insert(node, new_node, lvl);
		pthread_rwlock_unlock(&pfx_table->lock);
		pfx_table_notify_clients(pfx_table, record, true);
		return PFX_SUCCESS;
	}

	// tree is empty, record will be the root_node
	struct trie_node *new_node = NULL;

	if (pfx_table_create_node(&new_node, record) == PFX_ERROR) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_ERROR;
	}
	if (record->prefix.ver == LRTR_IPV4)
		pfx_table->ipv4 = new_node;
	else
		pfx_table->ipv6 = new_node;

	pthread_rwlock_unlock(&pfx_table->lock);
	pfx_table_notify_clients(pfx_table, record, true);
	return PFX_SUCCESS;
}